

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

void lyxml_ctx_restore(lyxml_ctx *xmlctx,lyxml_ctx *backup)

{
  lyxml_ctx *backup_local;
  lyxml_ctx *xmlctx_local;
  
  if (((xmlctx->status == LYXML_ELEM_CONTENT) || (xmlctx->status == LYXML_ATTR_CONTENT)) &&
     ((xmlctx->field_6).dynamic != '\0')) {
    free((xmlctx->field_3).prefix);
  }
  ly_set_erase(&xmlctx->elements,free);
  lyxml_ns_rm_all(xmlctx);
  xmlctx->in->current = backup->b_current;
  xmlctx->in->line = backup->b_line;
  backup->in = xmlctx->in;
  memcpy(xmlctx,backup,0x68);
  return;
}

Assistant:

void
lyxml_ctx_restore(struct lyxml_ctx *xmlctx, struct lyxml_ctx *backup)
{
    if (((xmlctx->status == LYXML_ELEM_CONTENT) || (xmlctx->status == LYXML_ATTR_CONTENT)) && xmlctx->dynamic) {
        /* free dynamic value */
        free((char *)xmlctx->value);
    }

    /* free elements */
    ly_set_erase(&xmlctx->elements, free);

    /* free ns */
    lyxml_ns_rm_all(xmlctx);

    /* restore in */
    xmlctx->in->current = backup->b_current;
    xmlctx->in->line = backup->b_line;
    backup->in = xmlctx->in;

    /* restore backup */
    memcpy(xmlctx, backup, sizeof *xmlctx);
}